

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

Vec_Ptr_t * Gia_IsoDeriveEquivPos(Gia_Man_t *pGia,int fForward,int fVerbose)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  Gia_IsoMan_t *p_00;
  abctime aVar5;
  double local_138;
  double local_128;
  double local_118;
  double local_108;
  double local_f8;
  double local_e8;
  int local_cc;
  int local_b4;
  int local_9c;
  int local_84;
  int local_6c;
  abctime clkTotal;
  abctime clk;
  int c;
  int i;
  int fRefinedAll;
  int fRefined;
  Vec_Ptr_t *vEquivs;
  Gia_IsoMan_t *p;
  int nFixedPoint;
  int nIterMax;
  int fVerbose_local;
  int fForward_local;
  Gia_Man_t *pGia_local;
  
  _fRefinedAll = (Vec_Ptr_t *)0x0;
  aVar3 = Abc_Clock();
  aVar4 = Abc_Clock();
  iVar1 = Gia_ManCiNum(pGia);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManCiNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2d9,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  iVar1 = Gia_ManPoNum(pGia);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManPoNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2da,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  Gia_ManCleanValue(pGia);
  p_00 = Gia_IsoManStart(pGia);
  Gia_IsoPrepare(p_00);
  Gia_IsoAssignUnique(p_00);
  aVar5 = Abc_Clock();
  p_00->timeStart = aVar5 - aVar3;
  if (fVerbose != 0) {
    aVar3 = Abc_Clock();
    Gia_IsoPrint(p_00,0,aVar3 - aVar4);
  }
  clk._4_4_ = 0;
  if (fForward == 0) {
    do {
      iVar1 = Vec_IntSize(p_00->vClasses);
      if (iVar1 < 1) break;
      c = 1;
      while (clk._4_4_ < 10000 && c != 0) {
        c = 0;
        clk._0_4_ = 0;
        while (clk._4_4_ < 10000 && (int)clk < 2) {
          aVar3 = Abc_Clock();
          Gia_IsoSimulate(p_00,clk._4_4_);
          aVar5 = Abc_Clock();
          p_00->timeSim = (aVar5 - aVar3) + p_00->timeSim;
          aVar3 = Abc_Clock();
          uVar2 = Gia_IsoSort(p_00);
          aVar5 = Abc_Clock();
          p_00->timeRefine = (aVar5 - aVar3) + p_00->timeRefine;
          if (fVerbose != 0) {
            aVar3 = Abc_Clock();
            Gia_IsoPrint(p_00,clk._4_4_ + 1,aVar3 - aVar4);
          }
          c = uVar2 | c;
          clk._4_4_ = clk._4_4_ + 1;
          if (uVar2 == 0) {
            local_84 = (int)clk + 1;
          }
          else {
            local_84 = 0;
          }
          clk._0_4_ = local_84;
        }
        clk._0_4_ = 0;
        while (clk._4_4_ < 10000 && (int)clk < 2) {
          aVar3 = Abc_Clock();
          Gia_IsoSimulateBack(p_00,clk._4_4_);
          aVar5 = Abc_Clock();
          p_00->timeSim = (aVar5 - aVar3) + p_00->timeSim;
          aVar3 = Abc_Clock();
          uVar2 = Gia_IsoSort(p_00);
          aVar5 = Abc_Clock();
          p_00->timeRefine = (aVar5 - aVar3) + p_00->timeRefine;
          if (fVerbose != 0) {
            aVar3 = Abc_Clock();
            Gia_IsoPrint(p_00,clk._4_4_ + 1,aVar3 - aVar4);
          }
          c = uVar2 | c;
          clk._4_4_ = clk._4_4_ + 1;
          if (uVar2 == 0) {
            local_9c = (int)clk + 1;
          }
          else {
            local_9c = 0;
          }
          clk._0_4_ = local_9c;
        }
      }
    } while (c != 0);
    while (iVar1 = Vec_IntSize(p_00->vClasses), 0 < iVar1) {
      Gia_IsoAssignOneClass(p_00,fVerbose);
      c = 1;
      while (clk._4_4_ < 10000 && c != 0) {
        c = 0;
        clk._0_4_ = 0;
        while (clk._4_4_ < 10000 && (int)clk < 1) {
          aVar3 = Abc_Clock();
          Gia_IsoSimulateBack(p_00,clk._4_4_);
          aVar5 = Abc_Clock();
          p_00->timeSim = (aVar5 - aVar3) + p_00->timeSim;
          aVar3 = Abc_Clock();
          uVar2 = Gia_IsoSort(p_00);
          aVar5 = Abc_Clock();
          p_00->timeRefine = (aVar5 - aVar3) + p_00->timeRefine;
          if (fVerbose != 0) {
            aVar3 = Abc_Clock();
            Gia_IsoPrint(p_00,clk._4_4_ + 1,aVar3 - aVar4);
          }
          c = uVar2 | c;
          clk._4_4_ = clk._4_4_ + 1;
          if (uVar2 == 0) {
            local_b4 = (int)clk + 1;
          }
          else {
            local_b4 = 0;
          }
          clk._0_4_ = local_b4;
        }
        clk._0_4_ = 0;
        while (clk._4_4_ < 10000 && (int)clk < 1) {
          aVar3 = Abc_Clock();
          Gia_IsoSimulate(p_00,clk._4_4_);
          aVar5 = Abc_Clock();
          p_00->timeSim = (aVar5 - aVar3) + p_00->timeSim;
          aVar3 = Abc_Clock();
          uVar2 = Gia_IsoSort(p_00);
          aVar5 = Abc_Clock();
          p_00->timeRefine = (aVar5 - aVar3) + p_00->timeRefine;
          if (fVerbose != 0) {
            aVar3 = Abc_Clock();
            Gia_IsoPrint(p_00,clk._4_4_ + 1,aVar3 - aVar4);
          }
          c = uVar2 | c;
          clk._4_4_ = clk._4_4_ + 1;
          if (uVar2 == 0) {
            local_cc = (int)clk + 1;
          }
          else {
            local_cc = 0;
          }
          clk._0_4_ = local_cc;
        }
      }
    }
    if (fVerbose != 0) {
      aVar3 = Abc_Clock();
      Gia_IsoPrint(p_00,clk._4_4_ + 2,aVar3 - aVar4);
    }
  }
  else {
    clk._0_4_ = 0;
    while (clk._4_4_ < 10000 && (int)clk < 2) {
      aVar3 = Abc_Clock();
      Gia_IsoSimulate(p_00,clk._4_4_);
      aVar5 = Abc_Clock();
      p_00->timeSim = (aVar5 - aVar3) + p_00->timeSim;
      aVar3 = Abc_Clock();
      iVar1 = Gia_IsoSort(p_00);
      aVar5 = Abc_Clock();
      p_00->timeRefine = (aVar5 - aVar3) + p_00->timeRefine;
      if (fVerbose != 0) {
        aVar3 = Abc_Clock();
        Gia_IsoPrint(p_00,clk._4_4_ + 1,aVar3 - aVar4);
      }
      clk._4_4_ = clk._4_4_ + 1;
      if (iVar1 == 0) {
        local_6c = (int)clk + 1;
      }
      else {
        local_6c = 0;
      }
      clk._0_4_ = local_6c;
    }
  }
  if (fVerbose != 0) {
    aVar3 = Abc_Clock();
    p_00->timeTotal = aVar3 - aVar4;
    p_00->timeOther = ((p_00->timeTotal - p_00->timeStart) - p_00->timeSim) - p_00->timeRefine;
    Abc_Print(1,"%s =","Start    ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_e8 = ((double)p_00->timeStart * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_e8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeStart * 1.0) / 1000000.0,local_e8);
    Abc_Print(1,"%s =","Simulate ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_f8 = ((double)p_00->timeSim * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_f8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeSim * 1.0) / 1000000.0,local_f8);
    Abc_Print(1,"%s =","Refine   ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_108 = ((double)(p_00->timeRefine - p_00->timeSort) * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_108 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",
              ((double)(p_00->timeRefine - p_00->timeSort) * 1.0) / 1000000.0,local_108);
    Abc_Print(1,"%s =","Sort     ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_118 = ((double)p_00->timeSort * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_118 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeSort * 1.0) / 1000000.0,local_118);
    Abc_Print(1,"%s =","Other    ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_128 = ((double)p_00->timeOther * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_128 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeOther * 1.0) / 1000000.0,local_128);
    Abc_Print(1,"%s =","TOTAL    ");
    if (((double)p_00->timeTotal != 0.0) || (NAN((double)p_00->timeTotal))) {
      local_138 = ((double)p_00->timeTotal * 100.0) / (double)p_00->timeTotal;
    }
    else {
      local_138 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p_00->timeTotal * 1.0) / 1000000.0,local_138);
  }
  iVar1 = Gia_ManPoNum(p_00->pGia);
  if (1 < iVar1) {
    _fRefinedAll = Gia_IsoCollectCosClasses(p_00,fVerbose);
  }
  Gia_IsoManTransferUnique(p_00);
  Gia_IsoManStop(p_00);
  return _fRefinedAll;
}

Assistant:

Vec_Ptr_t * Gia_IsoDeriveEquivPos( Gia_Man_t * pGia, int fForward, int fVerbose )
{
    int nIterMax = 10000;
    int nFixedPoint = 1;
    Gia_IsoMan_t * p;
    Vec_Ptr_t * vEquivs = NULL;
    int fRefined, fRefinedAll;
    int i, c;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    assert( Gia_ManCiNum(pGia) > 0 );
    assert( Gia_ManPoNum(pGia) > 0 );

    Gia_ManCleanValue( pGia );
    p = Gia_IsoManStart( pGia );
    Gia_IsoPrepare( p );
    Gia_IsoAssignUnique( p );
    p->timeStart = Abc_Clock() - clk;
    if ( fVerbose )
        Gia_IsoPrint( p, 0, Abc_Clock() - clkTotal );

//    Gia_IsoRecognizeMuxes( pGia );

    i = 0;
    if ( fForward )
    {
        for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
        {
            clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
            clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
            if ( fVerbose )
                Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
        }
    }
    else
    {
        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
            }
            if ( !fRefinedAll )
                break;
        }

//        Gia_IsoReportTopmost( p );

        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            Gia_IsoAssignOneClass( p, fVerbose );
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
//                    if ( fRefined )
//                        printf( "Refinedment happened.\n" );
                }
            }
        }

        if ( fVerbose )
            Gia_IsoPrint( p, i+2, Abc_Clock() - clkTotal );
    }
//    Gia_IsoPrintClasses( p );
    if ( fVerbose )
    {
        p->timeTotal = Abc_Clock() - clkTotal;
        p->timeOther = p->timeTotal - p->timeStart - p->timeSim - p->timeRefine;
        ABC_PRTP( "Start    ", p->timeStart,              p->timeTotal );
        ABC_PRTP( "Simulate ", p->timeSim,                p->timeTotal );
        ABC_PRTP( "Refine   ", p->timeRefine-p->timeSort, p->timeTotal );
        ABC_PRTP( "Sort     ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }

    if ( Gia_ManPoNum(p->pGia) > 1 )
        vEquivs = Gia_IsoCollectCosClasses( p, fVerbose );
    Gia_IsoManTransferUnique( p );
    Gia_IsoManStop( p );

    return vEquivs;
}